

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie_quant.c
# Opt level: O0

float lm_trie_quant_mboread(lm_trie_quant_t *quant,bitarr_address_t address,int order_minus_2)

{
  uint32 uVar1;
  float32 fVar2;
  bitarr_address_t address_00;
  int order_minus_2_local;
  lm_trie_quant_t *quant_local;
  bitarr_address_t address_local;
  
  address_00._12_4_ = 0;
  address_00.base = (void *)SUB128(address._0_12_,0);
  address_00.offset = SUB124(address._0_12_,8);
  uVar1 = bitarr_read_int25(address_00,quant->bo_bits,quant->bo_mask);
  fVar2 = bins_decode(quant->tables[order_minus_2] + 1,(ulong)uVar1);
  return (float)fVar2;
}

Assistant:

float32
lm_trie_quant_mboread(lm_trie_quant_t * quant, bitarr_address_t address,
                      int order_minus_2)
{
    return bins_decode(&quant->tables[order_minus_2][1],
                       bitarr_read_int25(address, quant->bo_bits,
                                         quant->bo_mask));
}